

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O2

ByteString * operator^(ByteString *__return_storage_ptr__,ByteString *lhs,ByteString *rhs)

{
  ulong uVar1;
  uchar *puVar2;
  uchar *puVar3;
  ulong uVar4;
  size_t i;
  
  uVar1 = (long)(lhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(lhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 <= uVar4) {
    uVar4 = uVar1;
  }
  __return_storage_ptr__->_vptr_ByteString = (_func_int **)&PTR__ByteString_0019e890;
  (__return_storage_ptr__->byteString).
  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (__return_storage_ptr__->byteString).
  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (__return_storage_ptr__->byteString).
  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->byteString).
  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.super__Tp_alloc_type.
  _vptr_SecureAllocator = (_func_int **)&PTR__SecureAllocator_0019e8c8;
  for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    puVar2 = (lhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((lhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish == puVar2) {
      puVar2 = sentinel;
    }
    puVar3 = (rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish == puVar3) {
      puVar3 = sentinel;
    }
    ByteString::operator+=(__return_storage_ptr__,puVar3[uVar1] ^ puVar2[uVar1]);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteString operator^(const ByteString& lhs, const ByteString& rhs)
{
	size_t xorLen = std::min(lhs.size(), rhs.size());
	ByteString rv;

	for (size_t i = 0; i < xorLen; i++)
	{
		rv += lhs.const_byte_str()[i] ^ rhs.const_byte_str()[i];
	}

	return rv;
}